

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O3

QDebug * __thiscall
QDebug::putTupleLikeImplImpl
          (QDebug *this,char *ns,char *what,size_t n,StreamTypeErased *ops,void **data)

{
  char *pcVar1;
  QString *pQVar2;
  storage_type *psVar3;
  Stream *pSVar4;
  QString *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QDebugStateSaver saver;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  psVar3 = (storage_type *)n;
  QDebugStateSaver::QDebugStateSaver(&local_58,this);
  pSVar4 = this->stream;
  pSVar4->space = false;
  if ((ns != (char *)0x0) && (*ns != '\0')) {
    pQVar5 = (QString *)0xffffffffffffffff;
    do {
      pcVar1 = ns + 1 + (long)pQVar5;
      pQVar5 = (QString *)((long)&(pQVar5->d).d + 1);
    } while (*pcVar1 != '\0');
    ba.m_data = psVar3;
    ba.m_size = (qsizetype)ns;
    QString::fromUtf8(&local_50,pQVar5,ba);
    ::QTextStream::operator<<(&pSVar4->ts,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar4 = this->stream;
    if (pSVar4->space == true) {
      ::QTextStream::operator<<(&pSVar4->ts,' ');
      pSVar4 = this->stream;
    }
    ba_00.m_data = psVar3;
    ba_00.m_size = (qsizetype)"::";
    QString::fromUtf8(&local_50,(QString *)0x2,ba_00);
    ::QTextStream::operator<<(&pSVar4->ts,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar4 = this->stream;
    if (pSVar4->space == true) {
      ::QTextStream::operator<<(&pSVar4->ts,' ');
      pSVar4 = this->stream;
    }
  }
  if (what == (char *)0x0) {
    pQVar5 = (QString *)0x0;
  }
  else {
    pQVar2 = (QString *)0xffffffffffffffff;
    do {
      pQVar5 = (QString *)((long)&(pQVar2->d).d + 1);
      pcVar1 = what + 1 + (long)pQVar2;
      pQVar2 = pQVar5;
    } while (*pcVar1 != '\0');
  }
  ba_01.m_data = psVar3;
  ba_01.m_size = (qsizetype)what;
  QString::fromUtf8(&local_50,pQVar5,ba_01);
  ::QTextStream::operator<<(&pSVar4->ts,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pSVar4 = this->stream;
  if (pSVar4->space == true) {
    ::QTextStream::operator<<(&pSVar4->ts,' ');
    pSVar4 = this->stream;
  }
  ::QTextStream::operator<<(&pSVar4->ts,'(');
  if (this->stream->space == true) {
    ::QTextStream::operator<<(&this->stream->ts,' ');
  }
  if (n != 0) {
    for (lVar6 = 0; (*ops[lVar6])(this,data[lVar6]), n - 1 != lVar6; lVar6 = lVar6 + 1) {
      pSVar4 = this->stream;
      ba_02.m_data = psVar3;
      ba_02.m_size = (qsizetype)", ";
      QString::fromUtf8(&local_50,(QString *)0x2,ba_02);
      ::QTextStream::operator<<(&pSVar4->ts,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (this->stream->space != false) {
        ::QTextStream::operator<<(&this->stream->ts,' ');
      }
    }
  }
  ::QTextStream::operator<<(&this->stream->ts,')');
  if (this->stream->space == true) {
    ::QTextStream::operator<<(&this->stream->ts,' ');
  }
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QDebug &QDebug::putTupleLikeImplImpl(const char *ns, const char *what,
                                     size_t n, StreamTypeErased *ops, const void **data)
{
    const QDebugStateSaver saver(*this);
    nospace();
    if (ns && *ns)
        *this << ns << "::";
    *this << what << '(';
    while (n--) {
        (*ops++)(*this, *data++);
        if (n)
            *this << ", ";
    }
    return *this << ')';
}